

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O2

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,LambdaNode *node)

{
  SymbolTable *this_00;
  TypeName TVar1;
  element_type *peVar2;
  LambdaNode *pLVar3;
  SemanticAnalyser *pSVar4;
  _Elt_pointer pRVar5;
  mapped_type *pmVar6;
  _List_node_base *p_Var7;
  value_type returnInfo;
  _Head_base<0UL,_Symbol_*,_false> local_e0;
  LambdaNode *local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  SemanticAnalyser *local_a0;
  stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = &this->hasReturn_;
  local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p & 0xffffffffffffff00;
  local_c0._M_string_length._0_1_ = 0;
  std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>::
  emplace_back<SemanticAnalyser::ReturnInfo>(&local_98->c,(ReturnInfo *)&local_c0);
  this_00 = &this->symbols_;
  local_a0 = this;
  SymbolTable::enterScope(this_00);
  p_Var7 = (_List_node_base *)&node->arguments_;
  local_d8 = node;
  while (pSVar4 = local_a0, pLVar3 = local_d8,
        p_Var7 = (((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                    *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var7 != (_List_node_base *)&node->arguments_) {
    std::make_unique<VariableSymbol,std::__cxx11::string_const&,TypeName_const&>
              (&local_c0,(TypeName *)(p_Var7 + 1));
    local_e0._M_head_impl = (Symbol *)local_c0._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)0x0;
    SymbolTable::addSymbol
              (this_00,(string *)(p_Var7 + 1),
               (unique_ptr<Symbol,_std::default_delete<Symbol>_> *)&local_e0);
    if (local_e0._M_head_impl != (Symbol *)0x0) {
      (*(local_e0._M_head_impl)->_vptr_Symbol[1])();
    }
    local_e0._M_head_impl = (Symbol *)0x0;
    if ((long *)local_c0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_c0._M_dataplus._M_p + 8))();
    }
  }
  peVar2 = (local_d8->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_StatementNode).super_Node._vptr_Node[2])(peVar2,local_a0);
  SymbolTable::leaveScope(this_00);
  pRVar5 = (pSVar4->hasReturn_).c.
           super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pRVar5 == (pSVar4->hasReturn_).c.
                super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pRVar5 = (pSVar4->hasReturn_).c.
             super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
  }
  local_c8 = *(undefined4 *)
              &pRVar5[-1].type.super__Optional_base<TypeName,_true,_true>._M_payload.
               super__Optional_payload_base<TypeName>._M_engaged;
  local_d0._0_1_ = pRVar5[-1].hasReturn;
  local_d0._1_3_ = *(undefined3 *)&pRVar5[-1].field_0x1;
  local_d0._4_4_ =
       *(TypeName *)
        &pRVar5[-1].type.super__Optional_base<TypeName,_true,_true>._M_payload.
         super__Optional_payload_base<TypeName>._M_payload;
  std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>::pop_back
            (&local_98->c);
  TVar1 = pLVar3->returnType_;
  if (TVar1 == Void) {
    if ((char)local_d0 != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"Void lambda does return!",(allocator<char> *)&local_90);
      reportError(&local_c0,(Node *)local_d8);
    }
  }
  else {
    if ((char)local_d0 == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"Lambda does not return any value!",
                 (allocator<char> *)&local_90);
      reportError(&local_c0,(Node *)local_d8);
    }
    if (((char)local_c8 == '\x01') && (TVar1 != local_d0._4_4_)) {
      pmVar6 = std::__detail::
               _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&TypeNameStrings_abi_cxx11_,&pLVar3->returnType_);
      std::operator+(&local_50,"Lambda should return ",pmVar6);
      std::operator+(&local_70,&local_50,", but returns ");
      pmVar6 = std::__detail::
               _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&TypeNameStrings_abi_cxx11_,(key_type *)((long)&local_d0 + 4));
      std::operator+(&local_90,&local_70,pmVar6);
      std::operator+(&local_c0,&local_90,"!");
      reportError(&local_c0,(Node *)local_d8);
    }
  }
  return;
}

Assistant:

void SemanticAnalyser::visit(const LambdaNode& node) 
{
  hasReturn_.push({});
  symbols_.enterScope();

  for(const auto& arg : node.getArguments())
  {
    symbols_.addSymbol(arg.first, std::make_unique<VariableSymbol>(arg.first, arg.second));
  }

  node.getBody().accept(*this);

  symbols_.leaveScope();
  const auto returnInfo = hasReturn_.top();
  hasReturn_.pop();

  if(node.getReturnType() != TypeName::Void && !returnInfo.hasReturn)
    reportError("Lambda does not return any value!", node);
  else if(node.getReturnType() == TypeName::Void && returnInfo.hasReturn)
    reportError("Void lambda does return!", node);
  else if(node.getReturnType() != TypeName::Void && 
    returnInfo.type.has_value() && node.getReturnType() != returnInfo.type.value())
    reportError("Lambda should return " + 
      TypeNameStrings.at(node.getReturnType()) + ", but returns " + 
        TypeNameStrings.at(returnInfo.type.value()) + "!", node);
}